

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<std::complex<float>,_1000>::Resize
          (TPZManVector<std::complex<float>,_1000> *this,int64_t newsize,complex<float> *object)

{
  complex<float> *pcVar1;
  _ComplexT _Var2;
  ostream *poVar3;
  complex<float> *pcVar4;
  long lVar5;
  int64_t i;
  long lVar6;
  ulong uVar7;
  double dVar8;
  
  if (-1 < newsize) {
    lVar6 = (this->super_TPZVec<std::complex<float>_>).fNElements;
    if (lVar6 != newsize) {
      lVar5 = (this->super_TPZVec<std::complex<float>_>).fNAlloc;
      if (lVar5 < newsize) {
        if ((ulong)newsize < 0x3e9) {
          pcVar1 = (this->super_TPZVec<std::complex<float>_>).fStore;
          pcVar4 = this->fExtAlloc;
          lVar5 = 0;
          if (lVar6 < 1) {
            lVar6 = lVar5;
          }
          for (; lVar6 != lVar5; lVar5 = lVar5 + 1) {
            pcVar4[lVar5]._M_value = pcVar1[lVar5]._M_value;
          }
          for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
            pcVar4[lVar6]._M_value = object->_M_value;
          }
          pcVar1 = (this->super_TPZVec<std::complex<float>_>).fStore;
          if (pcVar1 != (complex<float> *)0x0 && pcVar1 != pcVar4) {
            operator_delete__(pcVar1);
          }
          (this->super_TPZVec<std::complex<float>_>).fStore = pcVar4;
          (this->super_TPZVec<std::complex<float>_>).fNElements = newsize;
          (this->super_TPZVec<std::complex<float>_>).fNAlloc = 1000;
        }
        else {
          dVar8 = (double)lVar5 * 1.2;
          uVar7 = (long)dVar8;
          if (dVar8 < (double)newsize) {
            uVar7 = newsize;
          }
          pcVar4 = (complex<float> *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
          if (uVar7 != 0) {
            memset(pcVar4,0,uVar7 * 8);
          }
          pcVar1 = (this->super_TPZVec<std::complex<float>_>).fStore;
          lVar5 = 0;
          if (lVar6 < 1) {
            lVar6 = lVar5;
          }
          for (; lVar6 != lVar5; lVar5 = lVar5 + 1) {
            pcVar4[lVar5]._M_value = pcVar1[lVar5]._M_value;
          }
          _Var2 = object->_M_value;
          for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
            pcVar4[lVar6]._M_value = _Var2;
          }
          if (pcVar1 != (complex<float> *)0x0 && pcVar1 != this->fExtAlloc) {
            operator_delete__(pcVar1);
          }
          (this->super_TPZVec<std::complex<float>_>).fStore = pcVar4;
          (this->super_TPZVec<std::complex<float>_>).fNElements = newsize;
          (this->super_TPZVec<std::complex<float>_>).fNAlloc = uVar7;
        }
      }
      else {
        for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
          (this->super_TPZVec<std::complex<float>_>).fStore[lVar6]._M_value = object->_M_value;
        }
        (this->super_TPZVec<std::complex<float>_>).fNElements = newsize;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}